

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_vli lzma_index_stream_size(lzma_index *i)

{
  lzma_vli lVar1;
  lzma_vli lVar2;
  
  lVar1 = i->total_size;
  lVar2 = index_size(i->record_count,i->index_list_size);
  return lVar2 + lVar1 + 0x18;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_index_stream_size(const lzma_index *i)
{
	// Stream Header + Blocks + Index + Stream Footer
	return LZMA_STREAM_HEADER_SIZE + i->total_size
			+ index_size(i->record_count, i->index_list_size)
			+ LZMA_STREAM_HEADER_SIZE;
}